

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.c
# Opt level: O3

size_t utf8_check_full(char *buffer,size_t size,int32_t *codepoint)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  
  uVar2 = 0x1f;
  if (size != 2) {
    if (size == 3) {
      uVar2 = 0xf;
    }
    else {
      if (size != 4) {
        return 0;
      }
      uVar2 = 7;
    }
  }
  sVar3 = 1;
  uVar2 = (byte)*buffer & uVar2;
  do {
    uVar1 = uVar2;
    if (-0x41 < buffer[sVar3]) {
      return 0;
    }
    uVar2 = (byte)buffer[sVar3] & 0x3f | uVar1 << 6;
    sVar3 = sVar3 + 1;
  } while (size != sVar3);
  sVar3 = 0;
  if (((size != 2 || 0x7f < (int)uVar2) && ((int)uVar2 < 0x110000)) &&
     (sVar3 = 0, (uVar1 & 0x3ffffe0) != 0x360)) {
    if (((size == 3) && ((int)uVar2 < 0x800)) || ((size == 4 && ((int)uVar2 < 0x10000)))) {
      return 0;
    }
    sVar3 = 1;
    if (codepoint != (int32_t *)0x0) {
      *codepoint = uVar2;
    }
  }
  return sVar3;
}

Assistant:

size_t utf8_check_full(const char *buffer, size_t size, int32_t *codepoint)
{
    size_t i;
    int32_t value = 0;
    unsigned char u = (unsigned char)buffer[0];

    if(size == 2)
    {
        value = u & 0x1F;
    }
    else if(size == 3)
    {
        value = u & 0xF;
    }
    else if(size == 4)
    {
        value = u & 0x7;
    }
    else
        return 0;

    for(i = 1; i < size; i++)
    {
        u = (unsigned char)buffer[i];

        if(u < 0x80 || u > 0xBF) {
            /* not a continuation byte */
            return 0;
        }

        value = (value << 6) + (u & 0x3F);
    }

    if(value > 0x10FFFF) {
        /* not in Unicode range */
        return 0;
    }

    else if(0xD800 <= value && value <= 0xDFFF) {
        /* invalid code point (UTF-16 surrogate halves) */
        return 0;
    }

    else if((size == 2 && value < 0x80) ||
            (size == 3 && value < 0x800) ||
            (size == 4 && value < 0x10000)) {
        /* overlong encoding */
        return 0;
    }

    if(codepoint)
        *codepoint = value;

    return 1;
}